

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O1

int PHF::init<std::__cxx11::string,true>
              (phf *phf,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
              size_t n,size_t l,size_t a,phf_seed_t seed)

{
  long *plVar1;
  ulong *puVar2;
  pointer pcVar3;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  string *psVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  ulong uVar11;
  ulong uVar12;
  int *piVar13;
  void *pvVar14;
  string *psVar15;
  ulong uVar16;
  int iVar17;
  size_t sVar18;
  string *psVar19;
  uint uVar20;
  void *__nmemb;
  string *psVar21;
  undefined1 *local_118;
  long local_110;
  undefined1 local_108 [16];
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  uint32_t *local_98;
  size_t local_90;
  void *local_88;
  void *local_80;
  size_t local_78;
  string *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  void *local_48;
  string *local_40;
  phf_seed_t local_38;
  uint local_34;
  
  __nmemb = (void *)(n + (n == 0));
  pvVar14 = (void *)(l + (l == 0));
  sVar18 = 100;
  if (a < 100) {
    sVar18 = a;
  }
  phf->nodiv = true;
  if (__nmemb <= pvVar14) {
    pvVar14 = __nmemb;
  }
  uVar11 = (ulong)__nmemb / (ulong)pvVar14 - 1;
  uVar11 = uVar11 >> 1 | uVar11;
  uVar11 = uVar11 >> 2 | uVar11;
  uVar11 = uVar11 >> 4 | uVar11;
  uVar11 = uVar11 >> 8 | uVar11;
  uVar11 = uVar11 >> 0x10 | uVar11;
  uVar12 = (ulong)((long)__nmemb * 100) / (sVar18 + (sVar18 == 0)) - 1;
  uVar12 = uVar12 >> 1 | uVar12;
  uVar12 = uVar12 >> 2 | uVar12;
  uVar12 = uVar12 >> 4 | uVar12;
  uVar12 = uVar12 >> 8 | uVar12;
  uVar12 = uVar12 >> 0x10 | uVar12;
  uVar12 = uVar12 >> 0x20 | uVar12;
  local_90 = uVar12 + 1;
  local_78 = (uVar11 >> 0x20 | uVar11) + 1;
  if (local_78 == 0) {
    return 0x22;
  }
  if (local_90 == 0) {
    return 0x22;
  }
  local_38 = seed;
  local_70 = (string *)calloc((size_t)__nmemb,0x30);
  if ((local_70 == (string *)0x0) || (local_80 = calloc(local_78,8), local_80 == (void *)0x0)) {
    local_48 = (void *)0x0;
    local_80 = (void *)0x0;
  }
  else {
    local_88 = __nmemb;
    local_48 = (void *)uVar12;
    local_40 = (string *)n;
    if (n != 0) {
      local_34 = (int)local_78 - 1;
      psVar19 = local_70;
      do {
        local_118 = local_108;
        pcVar3 = (k->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,pcVar3,pcVar3 + k->_M_string_length);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,local_118,local_118 + local_110);
        uVar9 = phf_g<std::__cxx11::string>(&local_68,local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        if (local_118 != local_108) {
          operator_delete(local_118);
        }
        uVar20 = uVar9 & local_34;
        std::__cxx11::string::_M_assign(psVar19);
        *(uint *)(psVar19 + 0x20) = uVar20;
        plVar1 = (long *)((long)local_80 + (ulong)uVar20 * 8);
        *plVar1 = *plVar1 + 1;
        *(void **)(psVar19 + 0x28) = (void *)((long)local_80 + (ulong)uVar20 * 8);
        psVar19 = psVar19 + 0x30;
        k = k + 1;
        n = n - 1;
      } while (n != 0);
    }
    qsort(local_70,(size_t)local_88,0x30,phf_keycmp<std::__cxx11::string>);
    uVar11 = (long)local_48 + 0x40U >> 6;
    local_48 = calloc(uVar11 * 2,8);
    if (local_48 == (void *)0x0) {
      local_48 = (void *)0x0;
    }
    else {
      local_98 = (uint32_t *)calloc(local_78,4);
      if (local_98 != (uint32_t *)0x0) {
        if ((long)local_40 < 1) {
          uVar11 = 0;
        }
        else {
          local_88 = (void *)((long)local_48 + uVar11 * 8);
          psVar15 = local_70 + (long)local_40 * 0x30;
          local_34 = (int)local_90 - 1;
          uVar11 = 0;
          psVar19 = local_70;
          do {
            if (**(long **)(psVar19 + 0x28) == 0) break;
            lVar4 = **(long **)(psVar19 + 0x28);
            psVar21 = psVar19 + lVar4 * 0x30;
            uVar12 = 1;
            while (uVar9 = (uint32_t)uVar12, local_40 = psVar19, psVar8 = psVar19, 0 < lVar4) {
              while( true ) {
                local_f8 = local_e8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_f8,*(long *)psVar19,
                           *(long *)(psVar19 + 8) + *(long *)psVar19);
                local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_68,local_f8,local_f8 + local_f0);
                uVar10 = phf_f<std::__cxx11::string>(uVar9,&local_68,local_38);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p != &local_68.field_2) {
                  operator_delete(local_68._M_dataplus._M_p);
                }
                if (local_f8 != local_e8) {
                  operator_delete(local_f8);
                }
                uVar20 = uVar10 & local_34;
                uVar7 = (ulong)(uVar20 >> 6);
                uVar16 = 1L << ((byte)uVar20 & 0x3f);
                psVar8 = local_40;
                if (((*(ulong *)((long)local_48 + uVar7 * 8) >> ((ulong)uVar20 & 0x3f) & 1) != 0) ||
                   (uVar5 = *(ulong *)((long)local_88 + uVar7 * 8), (uVar5 & uVar16) != 0)) break;
                *(ulong *)((long)local_88 + uVar7 * 8) = uVar5 | uVar16;
                psVar19 = psVar19 + 0x30;
                if (psVar21 <= psVar19) goto joined_r0x00116d71;
              }
              for (; psVar8 < psVar21; psVar8 = psVar8 + 0x30) {
                local_d8 = local_c8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_d8,*(long *)psVar8,
                           *(long *)(psVar8 + 8) + *(long *)psVar8);
                local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_68,local_d8,local_d8 + local_d0);
                uVar10 = phf_f<std::__cxx11::string>(uVar9,&local_68,local_38);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p != &local_68.field_2) {
                  operator_delete(local_68._M_dataplus._M_p);
                }
                if (local_d8 != local_c8) {
                  operator_delete(local_d8);
                }
                bVar6 = (byte)(uVar10 & local_34) & 0x3f;
                puVar2 = (ulong *)((long)local_88 + (ulong)((uVar10 & local_34) >> 6) * 8);
                *puVar2 = *puVar2 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
              }
              uVar12 = uVar12 + 1;
              lVar4 = **(long **)(local_40 + 0x28);
              psVar21 = local_40 + lVar4 * 0x30;
              psVar19 = local_40;
            }
joined_r0x00116d71:
            for (; psVar8 < psVar21; psVar8 = psVar8 + 0x30) {
              local_b8 = local_a8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b8,*(long *)psVar8,*(long *)(psVar8 + 8) + *(long *)psVar8
                        );
              local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_68,local_b8,local_b8 + local_b0);
              uVar10 = phf_f<std::__cxx11::string>(uVar9,&local_68,local_38);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != &local_68.field_2) {
                operator_delete(local_68._M_dataplus._M_p);
              }
              if (local_b8 != local_a8) {
                operator_delete(local_b8);
              }
              puVar2 = (ulong *)((long)local_48 + (ulong)((uVar10 & local_34) >> 6) * 8);
              *puVar2 = *puVar2 | 1L << ((byte)(uVar10 & local_34) & 0x3f);
            }
            uVar11 = uVar11 & 0xffffffff;
            if (uVar11 < uVar12) {
              uVar11 = uVar12;
            }
            local_98[*(uint *)(local_40 + 0x20)] = uVar9;
            psVar19 = local_40 + **(long **)(local_40 + 0x28) * 0x30;
          } while (psVar19 < psVar15);
          uVar11 = uVar11 & 0xffffffff;
        }
        iVar17 = 0;
        phf->seed = local_38;
        phf->r = local_78;
        phf->m = local_90;
        phf->g = local_98;
        phf->d_max = uVar11;
        phf->g_op = PHF_G_UINT32_BAND_R;
        phf->g_jmp = (void *)0x0;
        goto LAB_00116e84;
      }
    }
  }
  piVar13 = __errno_location();
  iVar17 = *piVar13;
LAB_00116e84:
  free(local_48);
  free(local_80);
  free(local_70);
  return iVar17;
}

Assistant:

PHF_PUBLIC int PHF::init(struct phf *phf, const key_t k[], const size_t n, const size_t l, const size_t a, const phf_seed_t seed) {
	size_t n1 = PHF_MAX(n, 1); /* for computations that require n > 0 */
	size_t l1 = PHF_MAX(l, 1);
	size_t a1 = PHF_MAX(PHF_MIN(a, 100), 1);
	size_t r; /* number of buckets */
	size_t m; /* size of output array */
	phf_key<key_t> *B_k = NULL; /* linear bucket-slot array */
	size_t *B_z = NULL;         /* number of slots per bucket */
	phf_key<key_t> *B_p, *B_pe;
	phf_bits_t *T = NULL; /* bitmap to track index occupancy */
	phf_bits_t *T_b;      /* per-bucket working bitmap */
	size_t T_n;
	uint32_t *g = NULL; /* displacement map */
	uint32_t d_max = 0; /* maximum displacement value */
	int error;

	if ((phf->nodiv = nodiv)) {
		/* round to power-of-2 so we can use bit masks instead of modulo division */
		r = phf_powerup(n1 / PHF_MIN(l1, n1));
		m = phf_powerup((n1 * 100) / a1);
	} else {
		r = phf_primeup(PHF_HOWMANY(n1, l1));
		/* XXX: should we bother rounding m to prime number for small n? */
		m = phf_primeup((n1 * 100) / a1);
	}

	if (r == 0 || m == 0)
		return ERANGE;

	if (!(B_k = static_cast<phf_key<key_t> *>(calloc(n1, sizeof *B_k))))
		goto syerr;
	if (!(B_z = static_cast<size_t *>(calloc(r, sizeof *B_z))))
		goto syerr;

	for (size_t i = 0; i < n; i++) {
		phf_hash_t g = phf_g_mod_r<nodiv>(k[i], seed, r);

		B_k[i].k = k[i];
		B_k[i].g = g;
		B_k[i].n = &B_z[g];
		++*B_k[i].n;
	}

	qsort(B_k, n1, sizeof *B_k, reinterpret_cast<int(*)(const void *, const void *)>(&phf_keycmp<key_t>));

	T_n = PHF_HOWMANY(m, PHF_BITS(*T));
	if (!(T = static_cast<phf_bits_t *>(calloc(T_n * 2, sizeof *T))))
		goto syerr;
	T_b = &T[T_n]; /* share single allocation */

	/*
	 * FIXME: T_b[] is unnecessary. We could clear T[] the same way we
	 * clear T_b[]. In fact, at the end of generation T_b[] is identical
	 * to T[] because we don't clear T_b[] on success.
	 *
	 * We just need to tweak the current reset logic to stop before the
	 * key that failed, and then we can elide the commit to T[] at the
	 * end of the outer loop.
	 */

	if (!(g = static_cast<uint32_t *>(calloc(r, sizeof *g))))
		goto syerr;

	B_p = B_k;
	B_pe = &B_k[n];

	for (; B_p < B_pe && *B_p->n > 0; B_p += *B_p->n) {
		phf_key<key_t> *Bi_p, *Bi_pe;
		size_t d = 0;
		uint32_t f;
retry:
		d++;
		Bi_p = B_p;
		Bi_pe = B_p + *B_p->n;

		for (; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);

			if (phf_isset(T, f) || phf_isset(T_b, f)) {
				/* reset T_b[] */
				for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
					f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
					phf_clrbit(T_b, f);
				}

				goto retry;
			} else {
				phf_setbit(T_b, f);
			}
		}

		/* commit to T[] */
		for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
			phf_setbit(T, f);
		}

		/* commit to g[] */
		g[B_p->g] = d;
		d_max = PHF_MAX(d, d_max);
	}

	phf->seed = seed;
	phf->r = r;
	phf->m = m;

	phf->g = g;
	g = NULL;

	phf->d_max = d_max;
	phf->g_op = (nodiv)? phf::PHF_G_UINT32_BAND_R : phf::PHF_G_UINT32_MOD_R;
	phf->g_jmp = NULL;

	error = 0;

	goto clean;
syerr:
	error = errno;
clean:
	free(g);
	free(T);
	free(B_z);
	free(B_k);

	return error;
}